

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int ShSetFixedAttributeBindings(ShHandle handle,ShBindingTable *table)

{
  long *plVar1;
  TLinker *linker;
  TShHandleBase *base;
  ShBindingTable *table_local;
  ShHandle handle_local;
  
  if (handle == (ShHandle)0x0) {
    handle_local._4_4_ = 0;
  }
  else {
    plVar1 = (long *)(**(code **)(*handle + 0x18))();
    if (plVar1 == (long *)0x0) {
      handle_local._4_4_ = 0;
    }
    else {
      (**(code **)(*plVar1 + 0x48))(plVar1,table);
      handle_local._4_4_ = 1;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int ShSetFixedAttributeBindings(const ShHandle handle, const ShBindingTable* table)
{
    if (handle == nullptr)
        return 0;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());

    if (linker == nullptr)
        return 0;

    linker->setFixedAttributeBindings(table);
    return 1;
}